

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endec_pair_tester.hxx
# Opt level: O3

void __thiscall
cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_bf_cbc>_>::endec_pair_tester
          (endec_pair_tester<cryptox::symmetric_algorithm<&EVP_bf_cbc>_> *this)

{
  undefined8 in_RAX;
  pointer puVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result;
  long lVar2;
  value_type_conflict1 *__val;
  uint8_t input [1];
  uint8_t input_1 [1];
  uint8_t input_2 [1];
  undefined8 uStack_38;
  
  (this->key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_38 = in_RAX;
  puVar1 = (pointer)operator_new(0x20);
  (this->key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar1;
  (this->key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar1 + 0x20;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1[0x10] = '\0';
  puVar1[0x11] = '\0';
  puVar1[0x12] = '\0';
  puVar1[0x13] = '\0';
  puVar1[0x14] = '\0';
  puVar1[0x15] = '\0';
  puVar1[0x16] = '\0';
  puVar1[0x17] = '\0';
  puVar1[0x18] = '\0';
  puVar1[0x19] = '\0';
  puVar1[0x1a] = '\0';
  puVar1[0x1b] = '\0';
  puVar1[0x1c] = '\0';
  puVar1[0x1d] = '\0';
  puVar1[0x1e] = '\0';
  puVar1[0x1f] = '\0';
  (this->key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1 + 0x20;
  lVar2 = 0;
  do {
    RAND_bytes((uchar *)((long)&uStack_38 + 5),1);
    puVar1[lVar2] = uStack_38._5_1_;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x20);
  (this->salt).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->salt).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->salt).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (pointer)operator_new(0x20);
  (this->salt).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar1;
  (this->salt).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar1 + 0x20;
  puVar1[0x10] = '\0';
  puVar1[0x11] = '\0';
  puVar1[0x12] = '\0';
  puVar1[0x13] = '\0';
  puVar1[0x14] = '\0';
  puVar1[0x15] = '\0';
  puVar1[0x16] = '\0';
  puVar1[0x17] = '\0';
  puVar1[0x18] = '\0';
  puVar1[0x19] = '\0';
  puVar1[0x1a] = '\0';
  puVar1[0x1b] = '\0';
  puVar1[0x1c] = '\0';
  puVar1[0x1d] = '\0';
  puVar1[0x1e] = '\0';
  puVar1[0x1f] = '\0';
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  (this->salt).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1 + 0x20;
  lVar2 = 0;
  do {
    RAND_bytes((uchar *)((long)&uStack_38 + 6),1);
    puVar1[lVar2] = uStack_38._6_1_;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x20);
  (this->iv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->iv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->iv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (pointer)operator_new(0x20);
  (this->iv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar1;
  (this->iv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar1 + 0x20;
  puVar1[0x10] = '\0';
  puVar1[0x11] = '\0';
  puVar1[0x12] = '\0';
  puVar1[0x13] = '\0';
  puVar1[0x14] = '\0';
  puVar1[0x15] = '\0';
  puVar1[0x16] = '\0';
  puVar1[0x17] = '\0';
  puVar1[0x18] = '\0';
  puVar1[0x19] = '\0';
  puVar1[0x1a] = '\0';
  puVar1[0x1b] = '\0';
  puVar1[0x1c] = '\0';
  puVar1[0x1d] = '\0';
  puVar1[0x1e] = '\0';
  puVar1[0x1f] = '\0';
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  (this->iv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1 + 0x20;
  lVar2 = 0;
  do {
    RAND_bytes((uchar *)((long)&uStack_38 + 7),1);
    puVar1[lVar2] = uStack_38._7_1_;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x20);
  evp_cipher_context<cryptox::symmetric_algorithm<&EVP_bf_cbc>,&EVP_EncryptInit_ex,&EVP_EncryptUpdate,&EVP_EncryptFinal_ex>
  ::
  evp_cipher_context<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((evp_cipher_context<cryptox::symmetric_algorithm<&EVP_bf_cbc>,&EVP_EncryptInit_ex,&EVP_EncryptUpdate,&EVP_EncryptFinal_ex>
              *)&this->encryptor,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->iv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->iv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  evp_cipher_context<cryptox::symmetric_algorithm<&EVP_bf_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
  ::
  evp_cipher_context<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((evp_cipher_context<cryptox::symmetric_algorithm<&EVP_bf_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
              *)&this->decryptor,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->iv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->iv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  return;
}

Assistant:

endec_pair_tester()
		 : key(detail::make_random_vector()),
		   salt(detail::make_random_vector()),
		     iv(detail::make_random_vector()),
		  encryptor(key.begin(), key.end(), iv.begin(), iv.end()),
		  decryptor(key.begin(), key.end(), iv.begin(), iv.end()) {
		}